

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_result_t
dispatch_read(exr_const_context_t_conflict ctxt,void *buf,uint64_t sz,uint64_t *offsetp,
             int64_t *nread,_INTERNAL_EXR_READ_MODE rmode)

{
  exr_result_t eVar1;
  uint64_t uVar2;
  
  if (nread != (int64_t *)0x0) {
    *nread = -1;
  }
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar1 = 2;
  }
  else {
    if (offsetp == (uint64_t *)0x0) {
      eVar1 = (*ctxt->report_error)(ctxt,3,"read requested with no output offset pointer");
      return eVar1;
    }
    if (ctxt->read_fn == (exr_read_func_ptr_t)0x0) {
      eVar1 = (*ctxt->standard_error)(ctxt,7);
      return eVar1;
    }
    uVar2 = (*ctxt->read_fn)(ctxt,ctxt->user_data,buf,sz,*offsetp,ctxt->print_error);
    if (nread != (int64_t *)0x0) {
      *nread = uVar2;
    }
    if (0 < (long)uVar2) {
      *offsetp = *offsetp + uVar2;
    }
    eVar1 = 0;
    if (uVar2 != sz) {
      eVar1 = 0;
      if ((long)uVar2 < 0) {
        eVar1 = 10;
      }
      if (rmode != EXR_ALLOW_SHORT_READ) {
        eVar1 = 10;
      }
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
dispatch_read (
    exr_const_context_t          ctxt,
    void*                        buf,
    uint64_t                     sz,
    uint64_t*                    offsetp,
    int64_t*                     nread,
    enum _INTERNAL_EXR_READ_MODE rmode)
{
    int64_t      rval = -1;
    exr_result_t rv   = EXR_ERR_UNKNOWN;

    if (nread) *nread = rval;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!offsetp)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "read requested with no output offset pointer");

    if (ctxt->read_fn)
        rval = ctxt->read_fn (
            ctxt, ctxt->user_data, buf, sz, *offsetp, ctxt->print_error);
    else
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_READ);

    if (nread) *nread = rval;
    if (rval > 0) *offsetp += (uint64_t) rval;

    if (rval == (int64_t) sz || (rmode == EXR_ALLOW_SHORT_READ && rval >= 0))
        rv = EXR_ERR_SUCCESS;
    else
        rv = EXR_ERR_READ_IO;

    return rv;
}